

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * __thiscall String::replace(String *this,String *needle,String *replacement)

{
  usize *puVar1;
  usize uVar2;
  usize uVar3;
  char *pcVar4;
  char *__needle;
  char *__haystack;
  String result;
  String local_58;
  
  __haystack = this->data->str;
  pcVar4 = operator_cast_to_char_(needle);
  pcVar4 = strstr(__haystack,pcVar4);
  if (pcVar4 != (char *)0x0) {
    uVar2 = this->data->len;
    uVar3 = replacement->data->len;
    local_58.data = (Data *)operator_new__(uVar2 + uVar3 * 10 + 0x21);
    (local_58.data)->str = (char *)(local_58.data + 1);
    *(undefined1 *)&local_58.data[1].str = 0;
    (local_58.data)->len = 0;
    (local_58.data)->ref = 1;
    (local_58.data)->capacity = uVar2 + uVar3 * 10;
    do {
      append(&local_58,__haystack,(long)pcVar4 - (long)__haystack);
      append(&local_58,replacement);
      uVar2 = needle->data->len;
      __needle = operator_cast_to_char_(needle);
      __haystack = pcVar4 + uVar2;
      pcVar4 = strstr(__haystack,__needle);
    } while (pcVar4 != (char *)0x0);
    append(&local_58,__haystack,(usize)(this->data->str + (this->data->len - (long)__haystack)));
    this = operator=(this,&local_58);
    if ((local_58.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_58.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_58.data != (Data *)0x0)) {
        operator_delete__(local_58.data);
      }
    }
  }
  return this;
}

Assistant:

String& String::replace(const String& needle, const String& replacement)
{
  const char* p = data->str;
  const char* match = strstr(p, needle);
  if(!match)
    return *this;
  String result(data->len + replacement.data->len * 10);
  for(;;)
  {
    result.append(p, match - p);
    result.append(replacement);
    p = match + needle.data->len;
    match = strstr(p, needle);
    if(!match)
    {
      result.append(p, data->len - (p - data->str));
      return *this = result;
    }
  }
}